

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

void sysbvm_dwarf_debugInfo_line_setAddress
               (sysbvm_dwarf_debugInfo_builder_t *builder,uintptr_t value)

{
  sysbvm_dynarray_t *buffer;
  size_t sVar1;
  uint32_t addressOffset;
  
  buffer = &builder->line;
  sysbvm_dwarf_encodeByte(buffer,'\0');
  sysbvm_dwarf_encodeULEB128(buffer,9);
  sysbvm_dwarf_encodeByte(buffer,'\x02');
  sVar1 = sysbvm_dwarf_encodePointer(buffer,value);
  addressOffset = (uint32_t)sVar1;
  sysbvm_dynarray_add(&builder->lineTextAddresses,&addressOffset);
  (builder->lineProgramState).regAddress = (uint32_t)value;
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_line_setAddress(sysbvm_dwarf_debugInfo_builder_t *builder, uintptr_t value)
{
    sysbvm_dwarf_encodeByte(&builder->line, 0);
    sysbvm_dwarf_encodeULEB128(&builder->line, 1 + sizeof(value));
    sysbvm_dwarf_encodeByte(&builder->line, DW_LNE_set_address);
    uint32_t addressOffset = (uint32_t)sysbvm_dwarf_encodePointer(&builder->line, value);
    sysbvm_dynarray_add(&builder->lineTextAddresses, &addressOffset);
    builder->lineProgramState.regAddress = (uint32_t)value;
}